

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O2

void __thiscall
icu_63::DayPeriodRulesDataSink::setDayPeriodForHoursFromCutoffs
          (DayPeriodRulesDataSink *this,UErrorCode *errorCode)

{
  uint uVar1;
  ulong uVar2;
  int32_t startHour;
  ulong uVar3;
  DayPeriodRules *this_00;
  
  this_00 = (DayPeriodRules *)
            ((long)this->ruleSetNum * 100 + *(long *)((anonymous_namespace)::data + 8));
  uVar3 = 0;
  do {
    if (uVar3 == 0x19) {
      return;
    }
    uVar1 = this->cutoffs[uVar3];
    if ((uVar1 & 8) != 0) {
      if (this->period == DAYPERIOD_MIDNIGHT && uVar3 == 0) {
        this_00->fHasMidnight = '\x01';
      }
      else {
        if ((uVar3 != 0xc) || (this->period != DAYPERIOD_NOON)) {
LAB_002be812:
          *errorCode = U_INVALID_FORMAT_ERROR;
          return;
        }
        this_00->fHasNoon = '\x01';
      }
    }
    if ((uVar1 & 6) != 0) {
      uVar2 = uVar3 & 0xffffffff;
      do {
        uVar1 = (int)uVar2 + 1;
        if (uVar3 == uVar1) goto LAB_002be812;
        uVar2 = (ulong)uVar1;
        if (uVar1 == 0x19) {
          uVar2 = 0;
        }
      } while ((this->cutoffs[(int)uVar2] & 1) == 0);
      DayPeriodRules::add(this_00,(int32_t)uVar3,(int)uVar2,this->period);
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void setDayPeriodForHoursFromCutoffs(UErrorCode &errorCode) {
        DayPeriodRules &rule = data->rules[ruleSetNum];

        for (int32_t startHour = 0; startHour <= 24; ++startHour) {
            // AT cutoffs must be either midnight or noon.
            if (cutoffs[startHour] & (1 << CUTOFF_TYPE_AT)) {
                if (startHour == 0 && period == DayPeriodRules::DAYPERIOD_MIDNIGHT) {
                    rule.fHasMidnight = TRUE;
                } else if (startHour == 12 && period == DayPeriodRules::DAYPERIOD_NOON) {
                    rule.fHasNoon = TRUE;
                } else {
                    errorCode = U_INVALID_FORMAT_ERROR;  // Bad data.
                    return;
                }
            }

            // FROM/AFTER and BEFORE must come in a pair.
            if (cutoffs[startHour] & (1 << CUTOFF_TYPE_FROM) ||
                    cutoffs[startHour] & (1 << CUTOFF_TYPE_AFTER)) {
                for (int32_t hour = startHour + 1;; ++hour) {
                    if (hour == startHour) {
                        // We've gone around the array once and can't find a BEFORE.
                        errorCode = U_INVALID_FORMAT_ERROR;
                        return;
                    }
                    if (hour == 25) { hour = 0; }
                    if (cutoffs[hour] & (1 << CUTOFF_TYPE_BEFORE)) {
                        rule.add(startHour, hour, period);
                        break;
                    }
                }
            }
        }
    }